

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O2

void __thiscall Assimp::ValidateDSProcess::ReportWarning(ValidateDSProcess *this,char *msg,...)

{
  char in_AL;
  uint uVar1;
  Logger *this_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *__assertion;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cc8;
  va_list args;
  undefined1 local_c88 [16];
  undefined8 local_c78;
  undefined8 local_c70;
  undefined8 local_c68;
  undefined8 local_c60;
  undefined8 local_c58;
  undefined8 local_c48;
  undefined8 local_c38;
  undefined8 local_c28;
  undefined8 local_c18;
  undefined8 local_c08;
  undefined8 local_bf8;
  undefined8 local_be8;
  char szBuffer [3000];
  
  if (in_AL != '\0') {
    local_c58 = in_XMM0_Qa;
    local_c48 = in_XMM1_Qa;
    local_c38 = in_XMM2_Qa;
    local_c28 = in_XMM3_Qa;
    local_c18 = in_XMM4_Qa;
    local_c08 = in_XMM5_Qa;
    local_bf8 = in_XMM6_Qa;
    local_be8 = in_XMM7_Qa;
  }
  local_c78 = in_RDX;
  local_c70 = in_RCX;
  local_c68 = in_R8;
  local_c60 = in_R9;
  if (msg == (char *)0x0) {
    __assertion = "__null != msg";
    uVar1 = 0x61;
  }
  else {
    args[0].reg_save_area = local_c88;
    args[0].overflow_arg_area = &stack0x00000008;
    args[0].gp_offset = 0x10;
    args[0].fp_offset = 0x30;
    uVar1 = vsprintf(szBuffer,msg,args);
    if (0 < (int)uVar1) {
      this_00 = DefaultLogger::get();
      local_ce8._M_dataplus._M_p = (pointer)&local_ce8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_ce8,szBuffer,szBuffer + uVar1);
      std::operator+(&local_cc8,"Validation warning: ",&local_ce8);
      Logger::warn(this_00,local_cc8._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_cc8);
      std::__cxx11::string::~string((string *)&local_ce8);
      return;
    }
    __assertion = "iLen > 0";
    uVar1 = 0x68;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ValidateDataStructure.cpp"
                ,uVar1,"void Assimp::ValidateDSProcess::ReportWarning(const char *, ...)");
}

Assistant:

void ValidateDSProcess::ReportWarning(const char* msg,...)
{
    ai_assert(NULL != msg);

    va_list args;
    va_start(args,msg);

    char szBuffer[3000];
    const int iLen = vsprintf(szBuffer,msg,args);
    ai_assert(iLen > 0);

    va_end(args);
    ASSIMP_LOG_WARN("Validation warning: " + std::string(szBuffer,iLen));
}